

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O2

void __thiscall
presolve::HighsPostsolveStack::equalityRowAddition<HighsTripletPositionSlice>
          (HighsPostsolveStack *this,HighsInt row,HighsInt addedEqRow,double eqRowScale,
          HighsMatrixSlice<HighsTripletPositionSlice> *eqRowVec)

{
  int iVar1;
  int iVar2;
  pointer pNVar3;
  HighsInt *pHVar4;
  pointer piVar5;
  int iVar6;
  double *pdVar7;
  int *piVar8;
  long lVar9;
  undefined8 local_40;
  double local_38;
  
  pNVar3 = (this->rowValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->rowValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar3) {
    (this->rowValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar3;
  }
  piVar8 = eqRowVec->nodeIndex;
  pdVar7 = eqRowVec->nodeValue;
  pHVar4 = eqRowVec->nodePositions;
  iVar1 = eqRowVec->len;
  iVar6 = 0;
  for (lVar9 = 0; (long)iVar1 * 4 != lVar9; lVar9 = lVar9 + 4) {
    iVar2 = *(int *)((long)pHVar4 + lVar9);
    iVar6 = iVar2 - iVar6;
    piVar8 = piVar8 + iVar6;
    pdVar7 = pdVar7 + iVar6;
    local_40 = *pdVar7;
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
                *)&this->rowValues,
               (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + *piVar8,(double *)&local_40);
    iVar6 = iVar2;
  }
  piVar5 = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = (double)CONCAT44(piVar5[addedEqRow],piVar5[row]);
  local_38 = eqRowScale;
  HighsDataStack::push<presolve::HighsPostsolveStack::EqualityRowAddition,_0>
            (&this->reductionValues,(EqualityRowAddition *)&local_40);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (&this->reductionValues,&this->rowValues);
  reductionAdded(this,kEqualityRowAddition);
  return;
}

Assistant:

void equalityRowAddition(HighsInt row, HighsInt addedEqRow, double eqRowScale,
                           const HighsMatrixSlice<RowStorageFormat>& eqRowVec) {
    rowValues.clear();
    for (const HighsSliceNonzero& rowVal : eqRowVec)
      rowValues.emplace_back(origColIndex[rowVal.index()], rowVal.value());

    reductionValues.push(EqualityRowAddition{
        origRowIndex[row], origRowIndex[addedEqRow], eqRowScale});
    reductionValues.push(rowValues);
    reductionAdded(ReductionType::kEqualityRowAddition);
  }